

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 27.hpp
# Opt level: O3

void __thiscall
__gnu_cxx::new_allocator<njoy::ENDFtk::section::Type<27>>::
construct<njoy::ENDFtk::section::Type<27>,njoy::ENDFtk::section::Type<27>>
          (new_allocator<njoy::ENDFtk::section::Type<27>_> *this,Type<27> *__p,Type<27> *__args)

{
  double dVar1;
  pointer plVar2;
  pointer pdVar3;
  undefined4 uVar4;
  
  uVar4 = *(undefined4 *)&(__args->super_Base).field_0x14;
  (__p->super_Base).MT_ = (__args->super_Base).MT_;
  *(undefined4 *)&(__p->super_Base).field_0x14 = uVar4;
  uVar4 = *(undefined4 *)
           &(__args->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4;
  dVar1 = (__args->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_;
  (__p->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_ =
       (__args->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  *(undefined4 *)&(__p->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4 =
       uVar4;
  (__p->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_ = dVar1;
  *(undefined8 *)
   &(__p->table).super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long> =
       *(undefined8 *)
        &(__args->table).super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(__p->table).super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 8))->_M_head_impl =
       ((_Head_base<4UL,_long,_false> *)
       ((long)&(__args->table).super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long> + 8))->_M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(__p->table).super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(__args->table).super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x10))->_M_head_impl;
  dVar1 = (__args->table).super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Head_base<1UL,_double,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(__p->table).super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       ((_Head_base<2UL,_long,_false> *)
       ((long)&(__args->table).super_InterpolationBase.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x18))->_M_head_impl;
  (__p->table).super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = dVar1;
  (__p->table).super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (__args->table).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  plVar2 = (__args->table).super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (__p->table).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (__args->table).super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  (__p->table).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish = plVar2
  ;
  (__p->table).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (__args->table).super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  (__args->table).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (__args->table).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__args->table).super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  plVar2 = (__args->table).super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (__p->table).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (__args->table).super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  (__p->table).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish = plVar2
  ;
  (__p->table).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (__args->table).super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  (__args->table).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (__args->table).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__args->table).super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  pdVar3 = (__args->table).xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__p->table).xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__args->table).xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__p->table).xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar3;
  (__p->table).xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__args->table).xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__args->table).xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->table).xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->table).xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar3 = (__args->table).yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__p->table).yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (__args->table).yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__p->table).yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar3;
  (__p->table).yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (__args->table).yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__args->table).yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->table).yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->table).yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 27 > : protected Base {

    /* fields */
    TabulationRecord table;

  public:

    /* constructor */
    #include "ENDFtk/section/27/src/ctor.hpp"

    /* methods */

    /**
     *  @brief Return the Z number of the atom
     */
    unsigned int Z() const { return this->table.C2(); }

    /**
     *  @brief Return the Z number of the atom
     */
    unsigned int atomZ() const { return this->Z(); }

    /**
     *  @brief Return the number of interpolation regions
     */
    long NR() const { return this->table.NR(); }

    /**
     *  @brief Return the number of interpolation regions
     */
    long numberInterpolationRegions() const { return this->NR(); }

    /**
     *  @brief Return the number of points
     */
    long NP() const { return this->table.NP(); }

    /**
     *  @brief Return the number of points
     */
    long numberPoints() const { return this->NP(); }

    /**
     *  @brief Return the interpolation type for each regions
     */
    auto INT() const { return this->table.interpolants(); }

    /**
     *  @brief Return the interpolation type for each regions
     */
    auto interpolants() const { return this->INT(); }

    /**
     *  @brief Return the interpolation boundaries
     */
    auto NBT() const { return this->table.NBT(); }

    /**
     *  @brief Return the interpolation boundaries
     */
    auto boundaries() const { return this->NBT(); }

    /**
     *  @brief Return the x values
     */
    auto X() const { return this->table.x(); }

    /**
     *  @brief Return the form factor or scattering function values
     */
    auto H() const { return this->table.y(); }

    /**
     *  @brief Return the form factor or scattering function values
     */
    long NC() const { return this->table.NC() + 1; }

    /**
     *  @brief Return the energy values (common interface for interpolation
     *         tables)
     */
    auto x() const { return this->X(); }

    /**
     *  @brief Return the values (common interface for interpolation
     *         tables)
     */
    auto y() const { return this->H(); }

    #include "ENDFtk/section/3/src/print.hpp" // taken from MF3

    using Base::MT;
    using Base::sectionNumber;
    using Base::ZA;
    using Base::targetIdentifier;
    using Base::atomicWeightRatio;
    using Base::AWR;
  }